

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManPatRareImprove(Gia_Man_t *p,int RareLimit,int fVerbose)

{
  Vec_Wrd_t *vPatterns;
  int nWords;
  uint uVar1;
  int i;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Vec_Int_t *vRareCounts;
  Vec_Int_t *vPat;
  Vec_Flt_t *vQuo;
  Vec_Int_t *p_00;
  abctime aVar5;
  word *pwVar6;
  abctime time;
  abctime time_00;
  uint uVar7;
  uint n;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  uint local_78;
  Vec_Int_t *vBest;
  
  aVar3 = Abc_Clock();
  vPatterns = p->vSimsPi;
  nWords = vPatterns->nSize / p->vCis->nSize;
  p->vSimsPi = (Vec_Wrd_t *)0x0;
  fVar9 = Gia_ManPatGetTotalQuo(p,RareLimit,vPatterns,nWords);
  local_78 = 0;
  uVar1 = 0;
  if (0 < nWords << 6) {
    uVar1 = nWords << 6;
  }
  uVar8 = 0;
  for (n = 0; uVar1 != n; n = n + 1) {
    aVar4 = Abc_Clock();
    vRareCounts = Gia_SimCollectRare(p,vPatterns,RareLimit);
    vPat = Gia_ManPatCollectOne(p,vPatterns,n,nWords);
    vQuo = Gia_SimQualityImpact(p,vPat,vRareCounts);
    p_00 = Gia_SimCollectBest(vQuo);
    vBest = p_00;
    if (fVerbose != 0) {
      fVar10 = Gia_ManPatGetOneQuo(p,RareLimit,vPatterns,nWords,n);
      iVar2 = vRareCounts->nSize;
      if (p_00 == (Vec_Int_t *)0x0) {
        dVar12 = 0.0;
        uVar7 = 0;
      }
      else {
        uVar7 = p_00->nSize;
        i = Vec_IntEntry(p_00,0);
        fVar11 = Vec_FltEntry(vQuo,i);
        dVar12 = (double)fVar11;
      }
      printf("Pat %5d : Rare = %4d  Cands = %3d  Value = %8.3f  Change = %8.3f  ",(double)fVar10,
             dVar12,(ulong)n,(long)iVar2 / 2 & 0xffffffff,(ulong)uVar7);
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar5 - aVar4),time);
    }
    if (p_00 != (Vec_Int_t *)0x0) {
      iVar2 = rand();
      iVar2 = Vec_IntEntry(p_00,iVar2 % p_00->nSize);
      pwVar6 = Vec_WrdEntryP(vPatterns,iVar2 * nWords);
      pwVar6[n >> 6] = pwVar6[n >> 6] ^ 1L << ((byte)n & 0x3f);
      local_78 = local_78 + 1;
    }
    uVar8 = (long)vRareCounts->nSize / 2 & 0xffffffff;
    Vec_IntFree(vRareCounts);
    Vec_IntFree(vPat);
    free(vQuo->pArray);
    free(vQuo);
    Vec_IntFreeP(&vBest);
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  fVar10 = Gia_ManPatGetTotalQuo(p,RareLimit,vPatterns,nWords);
  p->vSimsPi = vPatterns;
  printf("Improved %d out of %d patterns using %d rare nodes: %.2f -> %.2f.  ",(double)fVar9,
         (double)fVar10,(ulong)local_78,(ulong)(uint)(nWords << 6),uVar8);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x82525c,(char *)(aVar4 - aVar3),time_00);
  return;
}

Assistant:

void Gia_ManPatRareImprove( Gia_Man_t * p, int RareLimit, int fVerbose )
{
    abctime clk = Abc_Clock();
    float FinalTotal, InitTotal;
    int n, nRares = 0, nChanges = 0, nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vPatterns = p->vSimsPi; p->vSimsPi = NULL;
    InitTotal = Gia_ManPatGetTotalQuo( p, RareLimit, vPatterns, nWords );
    for ( n = 0; n < 64*nWords; n++ )
    {
        abctime clk = Abc_Clock();
        Vec_Int_t * vRareCounts = Gia_SimCollectRare( p, vPatterns, RareLimit );
        Vec_Int_t * vPat        = Gia_ManPatCollectOne( p, vPatterns, n, nWords );
        Vec_Flt_t * vQuoIncs    = Gia_SimQualityImpact( p, vPat, vRareCounts );
        Vec_Int_t * vBest       = Gia_SimCollectBest( vQuoIncs );
        if ( fVerbose )
        {
            float PatQuo = Gia_ManPatGetOneQuo( p, RareLimit, vPatterns, nWords, n );
            printf( "Pat %5d : Rare = %4d  Cands = %3d  Value = %8.3f  Change = %8.3f  ", 
                n, Vec_IntSize(vRareCounts)/2, vBest ? Vec_IntSize(vBest) : 0, 
                PatQuo, vBest ? Vec_FltEntry(vQuoIncs, Vec_IntEntry(vBest,0)) : 0 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( vBest != NULL )
        {
            int VarBest = Vec_IntEntry( vBest, rand()%Vec_IntSize(vBest) );
            Abc_TtXorBit( Vec_WrdEntryP(vPatterns, VarBest*nWords), n );
            nChanges++;
        }
        nRares = Vec_IntSize(vRareCounts)/2;
        Vec_IntFree( vRareCounts );
        Vec_IntFree( vPat );
        Vec_FltFree( vQuoIncs );
        Vec_IntFreeP( &vBest );
    }
    if ( fVerbose )
        printf( "\n" );
    FinalTotal = Gia_ManPatGetTotalQuo( p, RareLimit, vPatterns, nWords );
    p->vSimsPi = vPatterns;

    printf( "Improved %d out of %d patterns using %d rare nodes: %.2f -> %.2f.  ", 
        nChanges, 64*nWords, nRares, InitTotal, FinalTotal );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}